

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase1387::run(TestCase1387 *this)

{
  Builder builder_00;
  Builder builder_01;
  Builder builder_02;
  Builder builder_03;
  SegmentBuilder *pSVar1;
  CapTableBuilder *pCVar2;
  WirePointer *pWVar3;
  Builder root2;
  Builder root;
  StructReader local_318;
  BuilderFor<capnproto_test::capnp::test::TestAllTypes> local_2e0;
  Builder local_2b8;
  Builder local_290;
  PointerBuilder local_268;
  SegmentReader *local_248;
  CapTableReader *pCStack_240;
  void *local_238;
  WirePointer *pWStack_230;
  StructDataBitCount local_228;
  StructPointerCount SStack_224;
  undefined2 uStack_222;
  int iStack_220;
  undefined4 uStack_21c;
  SegmentReader *local_218;
  CapTableReader *pCStack_210;
  void *local_208;
  WirePointer *pWStack_200;
  StructDataBitCount local_1f8;
  StructPointerCount SStack_1f4;
  undefined2 uStack_1f2;
  int iStack_1f0;
  undefined4 uStack_1ec;
  MallocMessageBuilder builder2;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestAllTypes>
            (&root,&builder.super_MessageBuilder);
  builder_00._builder.capTable = root._builder.capTable;
  builder_00._builder.segment = root._builder.segment;
  builder_00._builder.data = root._builder.data;
  builder_00._builder.pointers = root._builder.pointers;
  builder_00._builder.dataSize = root._builder.dataSize;
  builder_00._builder.pointerCount = root._builder.pointerCount;
  builder_00._builder._38_2_ = root._builder._38_2_;
  initTestMessage(builder_00);
  MallocMessageBuilder::MallocMessageBuilder(&builder2,0x400,GROW_HEURISTICALLY);
  StructBuilder::asReader(&root._builder);
  MessageBuilder::setRoot<capnproto_test::capnp::test::TestAllTypes::Reader>
            (&builder2.super_MessageBuilder,(Reader *)&local_318);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestAllTypes>
            (&local_290,&builder2.super_MessageBuilder);
  builder_01._builder.capTable = local_290._builder.capTable;
  builder_01._builder.segment = local_290._builder.segment;
  builder_01._builder.data = local_290._builder.data;
  builder_01._builder.pointers = local_290._builder.pointers;
  builder_01._builder.dataSize = local_290._builder.dataSize;
  builder_01._builder.pointerCount = local_290._builder.pointerCount;
  builder_01._builder._38_2_ = local_290._builder._38_2_;
  checkTestMessage(builder_01);
  MallocMessageBuilder::~MallocMessageBuilder(&builder2);
  MallocMessageBuilder::MallocMessageBuilder(&builder2,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestAllTypes>
            (&root2,&builder2.super_MessageBuilder);
  StructBuilder::asReader(&root._builder);
  local_318.dataSize = local_1f8;
  local_318.pointerCount = SStack_1f4;
  local_318._38_2_ = uStack_1f2;
  local_318.nestingLimit = iStack_1f0;
  local_318._44_4_ = uStack_1ec;
  local_318.data = local_208;
  local_318.pointers = pWStack_200;
  local_318.segment = local_218;
  local_318.capTable = pCStack_210;
  local_268.pointer = root2._builder.pointers + 2;
  local_268.segment = root2._builder.segment;
  local_268.capTable = root2._builder.capTable;
  PointerBuilder::setStruct(&local_268,&local_318,false);
  capnproto_test::capnp::test::TestAllTypes::Builder::getStructField(&local_2b8,&root2);
  builder_02._builder.capTable = local_2b8._builder.capTable;
  builder_02._builder.segment = local_2b8._builder.segment;
  builder_02._builder.data = local_2b8._builder.data;
  builder_02._builder.pointers = local_2b8._builder.pointers;
  builder_02._builder.dataSize = local_2b8._builder.dataSize;
  builder_02._builder.pointerCount = local_2b8._builder.pointerCount;
  builder_02._builder._38_2_ = local_2b8._builder._38_2_;
  checkTestMessage(builder_02);
  MallocMessageBuilder::~MallocMessageBuilder(&builder2);
  MallocMessageBuilder::MallocMessageBuilder(&builder2,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestAnyPointer>
            ((Builder *)&root2,&builder2.super_MessageBuilder);
  pWVar3 = root2._builder.pointers;
  pCVar2 = root2._builder.capTable;
  pSVar1 = root2._builder.segment;
  StructBuilder::asReader(&root._builder);
  local_318.dataSize = local_228;
  local_318.pointerCount = SStack_224;
  local_318._38_2_ = uStack_222;
  local_318.nestingLimit = iStack_220;
  local_318._44_4_ = uStack_21c;
  local_318.data = local_238;
  local_318.pointers = pWStack_230;
  local_318.segment = local_248;
  local_318.capTable = pCStack_240;
  local_268.segment = pSVar1;
  local_268.capTable = pCVar2;
  local_268.pointer = pWVar3;
  PointerBuilder::setStruct(&local_268,&local_318,false);
  local_318.segment = &(root2._builder.segment)->super_SegmentReader;
  local_318.capTable = &(root2._builder.capTable)->super_CapTableReader;
  local_318.data = root2._builder.pointers;
  AnyPointer::Builder::getAs<capnproto_test::capnp::test::TestAllTypes>
            (&local_2e0,(Builder *)&local_318);
  builder_03._builder.capTable = local_2e0._builder.capTable;
  builder_03._builder.segment = local_2e0._builder.segment;
  builder_03._builder.data = local_2e0._builder.data;
  builder_03._builder.pointers = local_2e0._builder.pointers;
  builder_03._builder.dataSize = local_2e0._builder.dataSize;
  builder_03._builder.pointerCount = local_2e0._builder.pointerCount;
  builder_03._builder._38_2_ = local_2e0._builder._38_2_;
  checkTestMessage(builder_03);
  MallocMessageBuilder::~MallocMessageBuilder(&builder2);
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return;
}

Assistant:

TEST(Encoding, StructSetters) {
  MallocMessageBuilder builder;
  auto root = builder.getRoot<TestAllTypes>();
  initTestMessage(root);

  {
    MallocMessageBuilder builder2;
    builder2.setRoot(root.asReader());
    checkTestMessage(builder2.getRoot<TestAllTypes>());
  }

  {
    MallocMessageBuilder builder2;
    auto root2 = builder2.getRoot<TestAllTypes>();
    root2.setStructField(root);
    checkTestMessage(root2.getStructField());
  }

  {
    MallocMessageBuilder builder2;
    auto root2 = builder2.getRoot<test::TestAnyPointer>();
    root2.getAnyPointerField().setAs<test::TestAllTypes>(root);
    checkTestMessage(root2.getAnyPointerField().getAs<test::TestAllTypes>());
  }
}